

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O1

void update_ref_speed(SpurUserParamsPtr spur)

{
  OdometryPtr p_Var1;
  long lVar2;
  
  lVar2 = 0;
  p_Var1 = get_odometry_ptr();
  do {
    spur->wheel_vel_smooth[lVar2] = p_Var1->wvel[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  spur->vref_smooth = p_Var1->v;
  spur->wref_smooth = p_Var1->w;
  return;
}

Assistant:

void update_ref_speed(SpurUserParamsPtr spur)
{
  OdometryPtr podm;
  int i;

  podm = get_odometry_ptr();
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    spur->wheel_vel_smooth[i] = podm->wvel[i];
  }
  spur->vref_smooth = podm->v;
  spur->wref_smooth = podm->w;
}